

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::ListSceneNamesRec
               (Prim *root,uint32_t depth,
               vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *sceneNames)

{
  vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  bool bVar1;
  Specifier SVar2;
  PrimMeta *pPVar3;
  value_type *__y;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  bool local_29;
  vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvStack_28;
  bool is_over;
  vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *sceneNames_local;
  Prim *pPStack_18;
  uint32_t depth_local;
  Prim *root_local;
  
  if (sceneNames ==
      (vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    root_local._7_1_ = false;
  }
  else if (depth < 0x20001) {
    pvStack_28 = sceneNames;
    sceneNames_local._4_4_ = depth;
    pPStack_18 = root;
    pPVar3 = Prim::metas(root);
    bVar1 = nonstd::optional_lite::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::has_value(&pPVar3->sceneName);
    if (bVar1) {
      SVar2 = Prim::specifier(pPStack_18);
      this = pvStack_28;
      local_29 = SVar2 == Over;
      pPVar3 = Prim::metas(pPStack_18);
      __y = nonstd::optional_lite::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&pPVar3->sceneName);
      ::std::make_pair<bool&,std::__cxx11::string_const&>
                (&local_58,&local_29,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__y);
      ::std::
      vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(this,&local_58);
      ::std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair(&local_58);
    }
    root_local._7_1_ = true;
  }
  else {
    root_local._7_1_ = false;
  }
  return root_local._7_1_;
}

Assistant:

bool ListSceneNamesRec(const tinyusdz::Prim &root, uint32_t depth,
                       std::vector<std::pair<bool, std::string>> *sceneNames) {
  if (!sceneNames) {
    return false;
  }

  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  if (root.metas().sceneName.has_value()) {
    bool is_over = (root.specifier() == Specifier::Over);

    sceneNames->push_back(
        std::make_pair(is_over, root.metas().sceneName.value()));
  }

  return true;
}